

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

void adios2::utils::mergeLists(int nV,char **listV,int nA,char **listA,char **mlist,bool *isVar)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__s2;
  ulong uVar5;
  char *__s1;
  int iVar6;
  int iVar7;
  
  if (((sortnames == '\0') || (listattrs != '\x01')) || ((attrsonly & 1) != 0)) {
    uVar4 = 0;
    if ((0 < nV) && ((attrsonly & 1) == 0)) {
      uVar4 = (ulong)(uint)nV;
      uVar5 = 0;
      do {
        mlist[uVar5] = listV[uVar5];
        isVar[uVar5] = true;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    if ((0 < nA) && (listattrs != '\0')) {
      uVar5 = 0;
      do {
        mlist[uVar4 + uVar5] = listA[uVar5];
        isVar[uVar5 + uVar4] = false;
        uVar5 = uVar5 + 1;
      } while ((uint)nA != uVar5);
    }
  }
  else {
    bVar1 = 0 < nV;
    bVar2 = 0 < nA;
    if (bVar1 || bVar2) {
      iVar6 = 0;
      iVar7 = 0;
      do {
        if (bVar2) {
          if (bVar1) {
            __s1 = listV[iVar7];
            __s2 = listA[iVar6];
            iVar3 = strcmp(__s1,__s2);
            if (iVar3 < 1) goto LAB_00117e94;
          }
          else {
            __s2 = listA[iVar6];
          }
          mlist[iVar6 + iVar7] = __s2;
          isVar[iVar6 + iVar7] = false;
          iVar6 = iVar6 + 1;
        }
        else {
          __s1 = listV[iVar7];
LAB_00117e94:
          mlist[iVar6 + iVar7] = __s1;
          isVar[iVar6 + iVar7] = true;
          iVar7 = iVar7 + 1;
        }
        bVar1 = iVar7 < nV;
        bVar2 = iVar6 < nA;
      } while (bVar1 || bVar2);
    }
  }
  return;
}

Assistant:

void mergeLists(int nV, char **listV, int nA, char **listA, char **mlist, bool *isVar)
{
    int v, a, idx;
    if (sortnames && listattrs && !attrsonly)
    {
        // merge sort the two lists
        v = 0;
        a = 0;
        while (v < nV || a < nA)
        {
            if (a < nA && (v >= nV || strcmp(listV[v], listA[a]) > 0))
            {
                // fully consumed var list or
                // next item in attr list is less than next item in var list
                mlist[v + a] = listA[a];
                isVar[v + a] = false;
                a++;
            }
            else
            {
                mlist[v + a] = listV[v];
                isVar[v + a] = true;
                v++;
            }
        }
    }
    else
    {
        // first add vars then attrs (if ask ed)
        idx = 0;
        if (!attrsonly)
        {
            for (v = 0; v < nV; v++)
            {
                mlist[idx] = listV[v];
                isVar[idx] = true;
                idx++;
            }
        }
        if (listattrs)
        {
            for (a = 0; a < nA; a++)
            {
                mlist[idx] = listA[a];
                isVar[idx] = false;
                idx++;
            }
        }
    }
}